

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

double __thiscall HighsMipSolverData::percentageInactiveIntegers(HighsMipSolverData *this)

{
  size_type sVar1;
  vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_> *this_00;
  size_type sVar2;
  long lVar3;
  long in_RDI;
  undefined1 auVar4 [16];
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x64d8));
  this_00 = HighsCliqueTable::getSubstitutions((HighsCliqueTable *)(in_RDI + 0x5be8));
  sVar2 = std::
          vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>::
          size(this_00);
  lVar3 = sVar1 - sVar2;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  return (1.0 - ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                (double)*(int *)(in_RDI + 0x66f8)) * 100.0;
}

Assistant:

double HighsMipSolverData::percentageInactiveIntegers() const {
  return 100.0 * (1.0 - double(integer_cols.size() -
                               cliquetable.getSubstitutions().size()) /
                            numintegercols);
}